

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

char __thiscall
Fl_Preferences::get(Fl_Preferences *this,char *key,double *value,double defaultValue)

{
  char *__nptr;
  
  __nptr = Node::get(this->node,key);
  if (__nptr != (char *)0x0) {
    defaultValue = atof(__nptr);
  }
  *value = defaultValue;
  return __nptr != (char *)0x0;
}

Assistant:

char Fl_Preferences::get( const char *key, double &value, double defaultValue ) {
  const char *v = node->get( key );
  value = v ? atof( v ) : defaultValue;
  return ( v != 0 );
}